

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::handleDotDereference
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *base,TString *field)

{
  TIntermediate *pTVar1;
  TIntermediate *pTVar2;
  TSourceLoc l;
  TSampler *base_00;
  TString *pTVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int rows;
  TBasicType TVar7;
  ulong uVar8;
  long *plVar9;
  char *pcVar10;
  TType *pTVar11;
  char *pcVar12;
  TIntermTyped *pTVar13;
  TQualifier *pTVar14;
  TMatrixSelector TVar15;
  TIntermConstantUnion *pTVar16;
  size_type sVar17;
  const_reference pvVar18;
  undefined4 extraout_var;
  long lVar19;
  TIntermTyped *pTVar20;
  pool_allocator<char> local_800;
  TString local_7f8;
  pool_allocator<char> local_7d0;
  TString local_7c8;
  TString local_7a0;
  TIntermConstantUnion *local_778;
  TIntermTyped *index_3;
  int member;
  bool fieldFound;
  TTypeList *fields;
  TIntermTyped *local_6c8;
  TIntermTyped *index_2;
  TType dereferenced_1;
  undefined1 local_620 [4];
  int column;
  TType dereferenced;
  undefined1 local_580 [8];
  TType dereferencedCol;
  int iStack_4d8;
  int local_4d4;
  undefined1 local_4cc [8];
  TSwizzleSelectors<glslang::TMatrixSelector> selectors_1;
  TIntermTyped *index_1;
  TIntermConstantUnion *local_370;
  TIntermTyped *index;
  TType vectorType;
  TType scalarType;
  TType type;
  TSwizzleSelectors<int> selectors;
  TString local_180;
  pool_allocator<char> local_158;
  TString local_150;
  TString local_128;
  pool_allocator<char> local_100;
  TString local_f8;
  pool_allocator<char> local_d0;
  TString local_c8;
  TString local_a0;
  _func_int **local_78;
  TString *local_70;
  undefined8 local_68;
  tMipsOperatorData local_60;
  TSampler *local_40;
  TSampler *sampler;
  TIntermTyped *result;
  TString *field_local;
  TIntermTyped *base_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  result = (TIntermTyped *)field;
  field_local = (TString *)base;
  base_local = (TIntermTyped *)loc;
  loc_local = (TSourceLoc *)this;
  variableCheck(this,(TIntermTyped **)&field_local);
  uVar8 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].inUseList)();
  pTVar20 = base_local;
  if ((uVar8 & 1) != 0) {
    pcVar10 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)result);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar20,"cannot apply to an array:",".",pcVar10);
    return (TIntermTyped *)field_local;
  }
  sampler = (TSampler *)field_local;
  plVar9 = (long *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].inUseList)
                             ();
  iVar5 = (**(code **)(*plVar9 + 0x38))();
  if (iVar5 == 0xe) {
    plVar9 = (long *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                               inUseList)();
    local_40 = (TSampler *)(**(code **)(*plVar9 + 0x40))();
    bVar4 = TSampler::isTexture(local_40);
    if ((bVar4) &&
       (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)result,"mips"), bVar4)) {
      local_78 = (base_local->super_TIntermNode)._vptr_TIntermNode;
      local_70 = (base_local->super_TIntermNode).loc.name;
      local_68._0_4_ = (base_local->super_TIntermNode).loc.string;
      local_68._4_4_ = (base_local->super_TIntermNode).loc.line;
      l.line = (int)((ulong)local_70 >> 0x20);
      l._0_12_ = *(undefined1 (*) [12])&base_local->super_TIntermNode;
      l._16_8_ = local_68;
      tMipsOperatorData::tMipsOperatorData(&local_60,l,(TIntermTyped *)0x0);
      std::
      vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
      ::push_back(&(this->mipsOperatorMipArg).
                   super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                  ,&local_60);
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)result,"mips");
      pTVar20 = base_local;
      if (bVar4) {
        pTVar11 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                     inUseList)();
        pool_allocator<char>::pool_allocator(&local_d0);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_c8,"",&local_d0);
        pool_allocator<char>::pool_allocator(&local_100);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_f8,"",&local_100);
        TType::getCompleteString(&local_a0,pTVar11,false,true,true,true,&local_c8,&local_f8);
        pcVar10 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            (&local_a0);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar20,"unexpected texture type for .mips[][] operator:",pcVar10,"");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_a0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_f8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_c8);
      }
      else {
        pcVar10 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)result);
        pTVar11 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                     inUseList)();
        pool_allocator<char>::pool_allocator(&local_158);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_150,"",&local_158);
        pool_allocator<char>::pool_allocator((pool_allocator<char> *)(selectors.components + 2));
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_180,"",(pool_allocator<char> *)(selectors.components + 2));
        TType::getCompleteString(&local_128,pTVar11,false,true,true,true,&local_150,&local_180);
        pcVar12 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            (&local_128);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar20,"unexpected operator on texture type:",pcVar10,pcVar12);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_128);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_180);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_150);
      }
    }
  }
  else {
    uVar8 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].stack.
                      super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                      ._M_impl.super__Vector_impl_data._M_start)();
    if (((uVar8 & 1) == 0) &&
       (uVar8 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].stack.
                          super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                          ._M_impl.super__Vector_impl_data._M_finish)(), (uVar8 & 1) == 0)) {
      uVar8 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].freeList)();
      if ((uVar8 & 1) == 0) {
        iVar5 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                          super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                          ._M_impl.super__Vector_impl_data._M_finish)();
        if ((iVar5 == 0xf) ||
           (iVar5 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                              super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                              ._M_impl.super__Vector_impl_data._M_finish)(), pTVar20 = base_local,
           iVar5 == 0x10)) {
          pTVar11 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                       inUseList)();
          _member = &TType::getStruct(pTVar11)->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          index_3._7_1_ = 0;
          for (index_3._0_4_ = 0; iVar5 = (int)index_3,
              sVar17 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                       size(_member), iVar5 < (int)sVar17; index_3._0_4_ = (int)index_3 + 1) {
            pvVar18 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                      operator[](_member,(long)(int)index_3);
            iVar5 = (*pvVar18->type->_vptr_TType[6])();
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)CONCAT44(extraout_var,iVar5),
                                    (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)result);
            if (bVar4) {
              index_3._7_1_ = 1;
              break;
            }
          }
          pTVar20 = base_local;
          if ((index_3._7_1_ & 1) == 0) {
            pcVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)result);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar20,"no such field in structure",pcVar10,"");
          }
          else {
            lVar19 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[1].pageSize
                     )();
            if ((lVar19 == 0) || (bVar4 = wasFlattened(this,(TIntermTyped *)field_local), !bVar4)) {
              plVar9 = (long *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator
                                         [2].inUseList)();
              lVar19 = (**(code **)(*plVar9 + 0x58))();
              if (((uint)*(undefined8 *)(lVar19 + 8) & 0x7f) == 2) {
                sampler = (TSampler *)
                          TIntermediate::foldDereference
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,(TIntermTyped *)field_local,(int)index_3,
                                     (TSourceLoc *)base_local);
              }
              else {
                local_778 = TIntermediate::addConstantUnion
                                      ((this->super_TParseContextBase).super_TParseVersions.
                                       intermediate,(int)index_3,(TSourceLoc *)base_local,false);
                pTVar20 = TIntermediate::addIndex
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,EOpIndexDirectStruct,(TIntermTyped *)field_local,
                                     &local_778->super_TIntermTyped,(TSourceLoc *)base_local);
                sampler = (TSampler *)pTVar20;
                pvVar18 = std::
                          vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                          operator[](_member,(long)(int)index_3);
                (*(pTVar20->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar20,pvVar18->type);
              }
            }
            else {
              sampler = (TSampler *)flattenAccess(this,(TIntermTyped *)field_local,(int)index_3);
            }
          }
        }
        else {
          pcVar10 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)result);
          pTVar11 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                       inUseList)();
          pool_allocator<char>::pool_allocator(&local_7d0);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_7c8,"",&local_7d0);
          pool_allocator<char>::pool_allocator(&local_800);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_7f8,"",&local_800);
          TType::getCompleteString(&local_7a0,pTVar11,false,true,true,true,&local_7c8,&local_7f8);
          pcVar12 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str(&local_7a0);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar20,"does not apply to this type:",pcVar10,pcVar12);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_7a0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_7f8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_7c8);
        }
      }
      else {
        TSwizzleSelectors<glslang::TMatrixSelector>::TSwizzleSelectors
                  ((TSwizzleSelectors<glslang::TMatrixSelector> *)local_4cc);
        pTVar13 = base_local;
        pTVar20 = result;
        iVar5 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].headerSkip)()
        ;
        rows = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].
                         currentPageOffset)();
        bVar4 = parseMatrixSwizzleSelector
                          (this,(TSourceLoc *)pTVar13,(TString *)pTVar20,iVar5,rows,
                           (TSwizzleSelectors<glslang::TMatrixSelector> *)local_4cc);
        if (!bVar4) {
          return (TIntermTyped *)sampler;
        }
        iVar5 = TSwizzleSelectors<glslang::TMatrixSelector>::size
                          ((TSwizzleSelectors<glslang::TMatrixSelector> *)local_4cc);
        if (iVar5 == 1) {
          plVar9 = (long *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                     inUseList)();
          pTVar14 = (TQualifier *)(**(code **)(*plVar9 + 0x58))();
          bVar4 = TQualifier::isFrontEndConstant(pTVar14);
          pTVar3 = field_local;
          if (bVar4) {
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            TVar15 = TSwizzleSelectors<glslang::TMatrixSelector>::operator[]
                               ((TSwizzleSelectors<glslang::TMatrixSelector> *)local_4cc,0);
            local_4d4 = TVar15.coord1;
            pTVar20 = TIntermediate::foldDereference
                                (pTVar1,(TIntermTyped *)pTVar3,local_4d4,(TSourceLoc *)base_local);
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            sampler = (TSampler *)pTVar20;
            TVar15 = TSwizzleSelectors<glslang::TMatrixSelector>::operator[]
                               ((TSwizzleSelectors<glslang::TMatrixSelector> *)local_4cc,0);
            iStack_4d8 = TVar15.coord2;
            sampler = (TSampler *)
                      TIntermediate::foldDereference
                                (pTVar1,pTVar20,iStack_4d8,(TSourceLoc *)base_local);
          }
          else {
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            register0x00000000 =
                 TSwizzleSelectors<glslang::TMatrixSelector>::operator[]
                           ((TSwizzleSelectors<glslang::TMatrixSelector> *)local_4cc,0);
            pTVar16 = TIntermediate::addConstantUnion
                                (pTVar2,dereferencedCol.spirvType._4_4_,(TSourceLoc *)base_local,
                                 false);
            sampler = (TSampler *)
                      TIntermediate::addIndex
                                (pTVar1,EOpIndexDirect,(TIntermTyped *)pTVar3,
                                 &pTVar16->super_TIntermTyped,(TSourceLoc *)base_local);
            pTVar11 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator
                                         [2].inUseList)();
            TType::TType((TType *)local_580,pTVar11,0,false);
            (**(code **)(*(long *)sampler + 0xe8))();
            base_00 = sampler;
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            dereferenced.spirvType =
                 (TSpirvType *)
                 TSwizzleSelectors<glslang::TMatrixSelector>::operator[]
                           ((TSwizzleSelectors<glslang::TMatrixSelector> *)local_4cc,0);
            pTVar16 = TIntermediate::addConstantUnion
                                (pTVar2,dereferenced.spirvType._4_4_,(TSourceLoc *)base_local,false)
            ;
            sampler = (TSampler *)
                      TIntermediate::addIndex
                                (pTVar1,EOpIndexDirect,(TIntermTyped *)base_00,
                                 &pTVar16->super_TIntermTyped,(TSourceLoc *)base_local);
            TType::TType((TType *)local_620,(TType *)local_580,0,false);
            (**(code **)(*(long *)sampler + 0xe8))(sampler,local_620);
            TType::~TType((TType *)local_620);
            TType::~TType((TType *)local_580);
          }
        }
        else {
          iVar5 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].
                            currentPageOffset)();
          dereferenced_1.spirvType._4_4_ =
               getMatrixComponentsColumn
                         (this,iVar5,(TSwizzleSelectors<glslang::TMatrixSelector> *)local_4cc);
          if (dereferenced_1.spirvType._4_4_ < 0) {
            local_6c8 = TIntermediate::addSwizzle<glslang::TMatrixSelector>
                                  ((this->super_TParseContextBase).super_TParseVersions.intermediate
                                   ,(TSwizzleSelectors<glslang::TMatrixSelector> *)local_4cc,
                                   (TSourceLoc *)base_local);
            pTVar20 = TIntermediate::addIndex
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 EOpMatrixSwizzle,(TIntermTyped *)field_local,local_6c8,
                                 (TSourceLoc *)base_local);
            sampler = (TSampler *)pTVar20;
            TVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                              super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                              ._M_impl.super__Vector_impl_data._M_finish)();
            plVar9 = (long *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                       inUseList)();
            lVar19 = (**(code **)(*plVar9 + 0x58))();
            uVar8 = *(ulong *)(lVar19 + 8);
            iVar5 = TSwizzleSelectors<glslang::TMatrixSelector>::size
                              ((TSwizzleSelectors<glslang::TMatrixSelector> *)local_4cc);
            TType::TType((TType *)&fields,TVar7,EvqTemporary,
                         (TPrecisionQualifier)(uVar8 >> 0x19) & 7,iVar5,0,0,false);
            (*(pTVar20->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar20,&fields);
            TType::~TType((TType *)&fields);
          }
          else {
            plVar9 = (long *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                       inUseList)();
            pTVar14 = (TQualifier *)(**(code **)(*plVar9 + 0x58))();
            bVar4 = TQualifier::isFrontEndConstant(pTVar14);
            pTVar3 = field_local;
            if (bVar4) {
              sampler = (TSampler *)
                        TIntermediate::foldDereference
                                  ((this->super_TParseContextBase).super_TParseVersions.intermediate
                                   ,(TIntermTyped *)field_local,dereferenced_1.spirvType._4_4_,
                                   (TSourceLoc *)base_local);
            }
            else {
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              pTVar16 = TIntermediate::addConstantUnion
                                  ((this->super_TParseContextBase).super_TParseVersions.intermediate
                                   ,dereferenced_1.spirvType._4_4_,(TSourceLoc *)base_local,false);
              sampler = (TSampler *)
                        TIntermediate::addIndex
                                  (pTVar1,EOpIndexDirect,(TIntermTyped *)pTVar3,
                                   &pTVar16->super_TIntermTyped,(TSourceLoc *)base_local);
              pTVar11 = (TType *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator
                                           [2].inUseList)();
              TType::TType((TType *)&index_2,pTVar11,0,false);
              (**(code **)(*(long *)sampler + 0xe8))(sampler,&index_2);
              TType::~TType((TType *)&index_2);
            }
          }
        }
      }
    }
    else {
      TSwizzleSelectors<int>::TSwizzleSelectors
                ((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
      pTVar13 = base_local;
      pTVar20 = result;
      uVar6 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].alignmentMask)
                        ();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x44])
                (this,pTVar13,pTVar20,(ulong)uVar6,(undefined1 *)((long)&type.spirvType + 4));
      uVar8 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].stack.
                        super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                        ._M_impl.super__Vector_impl_data._M_finish)();
      if ((uVar8 & 1) != 0) {
        iVar5 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
        if (iVar5 == 1) {
          return (TIntermTyped *)sampler;
        }
        TVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                          super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                          ._M_impl.super__Vector_impl_data._M_finish)();
        iVar5 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
        TType::TType((TType *)&scalarType.spirvType,TVar7,EvqTemporary,iVar5,0,0,false);
        this_local = (HlslParseContext *)
                     addConstructor(this,(TSourceLoc *)base_local,(TIntermTyped *)field_local,
                                    (TType *)&scalarType.spirvType);
        TType::~TType((TType *)&scalarType.spirvType);
        return (TIntermTyped *)this_local;
      }
      iVar5 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[3].alignmentMask)
                        ();
      if ((iVar5 == 1) &&
         (iVar5 = TSwizzleSelectors<int>::size
                            ((TSwizzleSelectors<int> *)((long)&type.spirvType + 4)), 1 < iVar5)) {
        TVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                          super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                          ._M_impl.super__Vector_impl_data._M_finish)();
        TType::TType((TType *)&vectorType.spirvType,TVar7,EvqTemporary,1,0,0,false);
        TVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                          super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                          ._M_impl.super__Vector_impl_data._M_finish)();
        iVar5 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
        TType::TType((TType *)&index,TVar7,EvqTemporary,iVar5,0,0,false);
        pTVar20 = base_local;
        pTVar13 = addConstructor(this,(TSourceLoc *)base_local,(TIntermTyped *)field_local,
                                 (TType *)&vectorType.spirvType);
        this_local = (HlslParseContext *)
                     addConstructor(this,(TSourceLoc *)pTVar20,pTVar13,(TType *)&index);
        TType::~TType((TType *)&index);
        TType::~TType((TType *)&vectorType.spirvType);
        return (TIntermTyped *)this_local;
      }
      plVar9 = (long *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                 inUseList)();
      pTVar14 = (TQualifier *)(**(code **)(*plVar9 + 0x58))();
      bVar4 = TQualifier::isFrontEndConstant(pTVar14);
      if (bVar4) {
        sampler = (TSampler *)
                  TIntermediate::foldSwizzle
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             (TIntermTyped *)field_local,
                             (TSwizzleSelectors<int> *)((long)&type.spirvType + 4),
                             (TSourceLoc *)base_local);
      }
      else {
        iVar5 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
        if (iVar5 == 1) {
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar5 = TSwizzleSelectors<int>::operator[]
                            ((TSwizzleSelectors<int> *)((long)&type.spirvType + 4),0);
          local_370 = TIntermediate::addConstantUnion(pTVar1,iVar5,(TSourceLoc *)base_local,false);
          pTVar20 = TIntermediate::addIndex
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpIndexDirect,(TIntermTyped *)field_local,
                               &local_370->super_TIntermTyped,(TSourceLoc *)base_local);
          sampler = (TSampler *)pTVar20;
          TVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                            super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                            ._M_impl.super__Vector_impl_data._M_finish)();
          TType::TType((TType *)&index_1,TVar7,EvqTemporary,1,0,0,false);
          (*(pTVar20->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar20,&index_1);
          TType::~TType((TType *)&index_1);
        }
        else {
          pTVar20 = TIntermediate::addSwizzle<int>
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               (TSwizzleSelectors<int> *)((long)&type.spirvType + 4),
                               (TSourceLoc *)base_local);
          pTVar20 = TIntermediate::addIndex
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpVectorSwizzle,(TIntermTyped *)field_local,pTVar20,
                               (TSourceLoc *)base_local);
          sampler = (TSampler *)pTVar20;
          TVar7 = (*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].stack.
                            super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                            ._M_impl.super__Vector_impl_data._M_finish)();
          plVar9 = (long *)(*(code *)(field_local->_M_dataplus).super_allocator_type.allocator[2].
                                     inUseList)();
          lVar19 = (**(code **)(*plVar9 + 0x58))();
          uVar8 = *(ulong *)(lVar19 + 8);
          iVar5 = TSwizzleSelectors<int>::size
                            ((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
          TType::TType((TType *)(selectors_1.components + 3),TVar7,EvqTemporary,
                       (TPrecisionQualifier)(uVar8 >> 0x19) & 7,iVar5,0,0,false);
          (*(pTVar20->super_TIntermNode)._vptr_TIntermNode[0x1d])
                    (pTVar20,selectors_1.components + 3);
          TType::~TType((TType *)(selectors_1.components + 3));
        }
      }
    }
  }
  return (TIntermTyped *)(HlslParseContext *)sampler;
}

Assistant:

TIntermTyped* HlslParseContext::handleDotDereference(const TSourceLoc& loc, TIntermTyped* base, const TString& field)
{
    variableCheck(base);

    if (base->isArray()) {
        error(loc, "cannot apply to an array:", ".", field.c_str());
        return base;
    }

    TIntermTyped* result = base;

    if (base->getType().getBasicType() == EbtSampler) {
        // Handle .mips[mipid][pos] operation on textures
        const TSampler& sampler = base->getType().getSampler();
        if (sampler.isTexture() && field == "mips") {
            // Push a null to signify that we expect a mip level under operator[] next.
            mipsOperatorMipArg.push_back(tMipsOperatorData(loc, nullptr));
            // Keep 'result' pointing to 'base', since we expect an operator[] to go by next.
        } else {
            if (field == "mips")
                error(loc, "unexpected texture type for .mips[][] operator:",
                      base->getType().getCompleteString().c_str(), "");
            else
                error(loc, "unexpected operator on texture type:", field.c_str(),
                      base->getType().getCompleteString().c_str());
        }
    } else if (base->isVector() || base->isScalar()) {
        TSwizzleSelectors<TVectorSelector> selectors;
        parseSwizzleSelector(loc, field, base->getVectorSize(), selectors);

        if (base->isScalar()) {
            if (selectors.size() == 1)
                return result;
            else {
                TType type(base->getBasicType(), EvqTemporary, selectors.size());
                return addConstructor(loc, base, type);
            }
        }
        // Use EOpIndexDirect (below) with vec1.x so that it remains l-value (Test/hlsl.swizzle.vec1.comp)
        if (base->getVectorSize() == 1 && selectors.size() > 1) {
            TType scalarType(base->getBasicType(), EvqTemporary, 1);
            TType vectorType(base->getBasicType(), EvqTemporary, selectors.size());
            return addConstructor(loc, addConstructor(loc, base, scalarType), vectorType);
        }

        if (base->getType().getQualifier().isFrontEndConstant())
            result = intermediate.foldSwizzle(base, selectors, loc);
        else {
            if (selectors.size() == 1) {
                TIntermTyped* index = intermediate.addConstantUnion(selectors[0], loc);
                result = intermediate.addIndex(EOpIndexDirect, base, index, loc);
                result->setType(TType(base->getBasicType(), EvqTemporary));
            } else {
                TIntermTyped* index = intermediate.addSwizzle(selectors, loc);
                result = intermediate.addIndex(EOpVectorSwizzle, base, index, loc);
                result->setType(TType(base->getBasicType(), EvqTemporary, base->getType().getQualifier().precision,
                                selectors.size()));
            }
        }
    } else if (base->isMatrix()) {
        TSwizzleSelectors<TMatrixSelector> selectors;
        if (! parseMatrixSwizzleSelector(loc, field, base->getMatrixCols(), base->getMatrixRows(), selectors))
            return result;

        if (selectors.size() == 1) {
            // Representable by m[c][r]
            if (base->getType().getQualifier().isFrontEndConstant()) {
                result = intermediate.foldDereference(base, selectors[0].coord1, loc);
                result = intermediate.foldDereference(result, selectors[0].coord2, loc);
            } else {
                result = intermediate.addIndex(EOpIndexDirect, base,
                                               intermediate.addConstantUnion(selectors[0].coord1, loc),
                                               loc);
                TType dereferencedCol(base->getType(), 0);
                result->setType(dereferencedCol);
                result = intermediate.addIndex(EOpIndexDirect, result,
                                               intermediate.addConstantUnion(selectors[0].coord2, loc),
                                               loc);
                TType dereferenced(dereferencedCol, 0);
                result->setType(dereferenced);
            }
        } else {
            int column = getMatrixComponentsColumn(base->getMatrixRows(), selectors);
            if (column >= 0) {
                // Representable by m[c]
                if (base->getType().getQualifier().isFrontEndConstant())
                    result = intermediate.foldDereference(base, column, loc);
                else {
                    result = intermediate.addIndex(EOpIndexDirect, base, intermediate.addConstantUnion(column, loc),
                                                   loc);
                    TType dereferenced(base->getType(), 0);
                    result->setType(dereferenced);
                }
            } else {
                // general case, not a column, not a single component
                TIntermTyped* index = intermediate.addSwizzle(selectors, loc);
                result = intermediate.addIndex(EOpMatrixSwizzle, base, index, loc);
                result->setType(TType(base->getBasicType(), EvqTemporary, base->getType().getQualifier().precision,
                                      selectors.size()));
           }
        }
    } else if (base->getBasicType() == EbtStruct || base->getBasicType() == EbtBlock) {
        const TTypeList* fields = base->getType().getStruct();
        bool fieldFound = false;
        int member;
        for (member = 0; member < (int)fields->size(); ++member) {
            if ((*fields)[member].type->getFieldName() == field) {
                fieldFound = true;
                break;
            }
        }
        if (fieldFound) {
            if (base->getAsSymbolNode() && wasFlattened(base)) {
                result = flattenAccess(base, member);
            } else {
                if (base->getType().getQualifier().storage == EvqConst)
                    result = intermediate.foldDereference(base, member, loc);
                else {
                    TIntermTyped* index = intermediate.addConstantUnion(member, loc);
                    result = intermediate.addIndex(EOpIndexDirectStruct, base, index, loc);
                    result->setType(*(*fields)[member].type);
                }
            }
        } else
            error(loc, "no such field in structure", field.c_str(), "");
    } else
        error(loc, "does not apply to this type:", field.c_str(), base->getType().getCompleteString().c_str());

    return result;
}